

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O1

void fdsocket_select_result_input(int fd,int event)

{
  Plug *plug;
  void *e;
  ssize_t sVar1;
  int *piVar2;
  uint uVar3;
  char buf [20480];
  int in_stack_ffffffffffffafdc;
  int local_501c;
  undefined1 local_5018 [20488];
  
  local_501c = fd;
  e = find234(fdsocket_by_infd,&local_501c,fdsocket_infd_find);
  if (e != (void *)0x0) {
    sVar1 = read(*(int *)((long)e + 4),local_5018,0x5000);
    uVar3 = (uint)sVar1;
    if ((int)uVar3 < 1) {
      del234(fdsocket_by_infd,e);
      uxsel_del(in_stack_ffffffffffffafdc);
      close(*(int *)((long)e + 4));
      *(undefined4 *)((long)e + 4) = 0xffffffff;
      plug = *(Plug **)((long)e + 0x2088);
      if ((int)uVar3 < 0) {
        piVar2 = __errno_location();
        plug_closing_errno(plug,*piVar2);
      }
      else {
        (*plug->vt->closing)(plug,PLUGCLOSE_NORMAL,(char *)0x0);
      }
    }
    else {
      (**(code **)(**(long **)((long)e + 0x2088) + 0x10))
                (*(long **)((long)e + 0x2088),0,local_5018,uVar3 & 0x7fffffff);
    }
  }
  return;
}

Assistant:

static void fdsocket_select_result_input(int fd, int event)
{
    FdSocket *fds;
    char buf[20480];
    int retd;

    if (!(fds = find234(fdsocket_by_infd, &fd, fdsocket_infd_find)))
        return;

    retd = read(fds->infd, buf, sizeof(buf));
    if (retd > 0) {
        plug_receive(fds->plug, 0, buf, retd);
    } else {
        del234(fdsocket_by_infd, fds);
        uxsel_del(fds->infd);
        close(fds->infd);
        fds->infd = -1;

        if (retd < 0) {
            plug_closing_errno(fds->plug, errno);
        } else {
            plug_closing_normal(fds->plug);
        }
    }
}